

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

type cm::operator==(basic_string_view<char,_std::char_traits<char>_> *l,String *r)

{
  size_t __n;
  char *__s1;
  int iVar1;
  size_type __rlen;
  type tVar2;
  string_view sVar3;
  
  __n = l->_M_len;
  __s1 = l->_M_str;
  sVar3 = AsStringView<cm::String>::view(r);
  if (__n == sVar3._M_len) {
    if (__n == 0) {
      tVar2 = true;
    }
    else {
      iVar1 = bcmp(__s1,sVar3._M_str,__n);
      tVar2 = iVar1 == 0;
    }
  }
  else {
    tVar2 = false;
  }
  return tVar2;
}

Assistant:

static string_view view(string_view const& s) { return s; }